

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O1

bool __thiscall
cmSourceGroupCommand::checkArgumentsPreconditions
          (cmSourceGroupCommand *this,ParsedArguments *parsedArguments,string *errorMsg)

{
  bool bVar1;
  
  bVar1 = checkSingleParameterArgumentPreconditions
                    (this,(string *)(anonymous_namespace)::kPrefixOptionName_abi_cxx11_,
                     parsedArguments,errorMsg);
  if (bVar1) {
    bVar1 = checkSingleParameterArgumentPreconditions
                      (this,(string *)(anonymous_namespace)::kTreeOptionName_abi_cxx11_,
                       parsedArguments,errorMsg);
    if (bVar1) {
      bVar1 = checkSingleParameterArgumentPreconditions
                        (this,(string *)&(anonymous_namespace)::kRegexOptionName_abi_cxx11_,
                         parsedArguments,errorMsg);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool cmSourceGroupCommand::checkArgumentsPreconditions(
  const ParsedArguments& parsedArguments, std::string& errorMsg) const
{
  return checkSingleParameterArgumentPreconditions(
           kPrefixOptionName, parsedArguments, errorMsg) &&
    checkSingleParameterArgumentPreconditions(kTreeOptionName, parsedArguments,
                                              errorMsg) &&
    checkSingleParameterArgumentPreconditions(kRegexOptionName,
                                              parsedArguments, errorMsg);
}